

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcErrorList.cpp
# Opt level: O2

size_t __thiscall GrcErrorList::NumberOfWarningsGiven(GrcErrorList *this)

{
  pointer ppGVar1;
  pointer ppGVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  
  ppGVar1 = (this->m_vperr).super__Vector_base<GrcErrorItem_*,_std::allocator<GrcErrorItem_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppGVar2 = (this->m_vperr).super__Vector_base<GrcErrorItem_*,_std::allocator<GrcErrorItem_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  iVar4 = 0;
  for (uVar5 = 0; (ulong)uVar5 < (ulong)((long)ppGVar2 - (long)ppGVar1 >> 3); uVar5 = uVar5 + 1) {
    if (ppGVar1[(int)uVar5]->m_fFatal == false) {
      bVar3 = IgnoreWarning(this,ppGVar1[uVar5]->m_nID);
      iVar4 = iVar4 + (uint)!bVar3;
    }
  }
  return (long)iVar4;
}

Assistant:

size_t GrcErrorList::NumberOfWarningsGiven()
{
	int cerrRet = 0;
	for (auto ierr = 0U; ierr < m_vperr.size(); ++ierr)
	{
		if (!IsFatal(ierr) && !IgnoreWarning(m_vperr[ierr]->m_nID))
			cerrRet++;
	}
	return cerrRet;
}